

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate_boolean
               (xpath_node_set_raw *ns,size_t first,xpath_ast_node *expr,xpath_stack *stack,
               bool once)

{
  size_t sVar1;
  bool bVar2;
  xpath_value_type xVar3;
  size_t sVar4;
  xpath_node *pxVar5;
  xml_node_struct *extraout_RDX;
  xml_node_struct *__length;
  undefined1 local_70 [8];
  xpath_context c;
  xpath_node *it;
  xpath_node *last;
  size_t size;
  size_t i;
  bool once_local;
  xpath_stack *stack_local;
  xpath_ast_node *expr_local;
  size_t first_local;
  xpath_node_set_raw *ns_local;
  
  sVar4 = xpath_node_set_raw::size(ns);
  if (sVar4 < first) {
    __assert_fail("ns.size() >= first",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                  ,0x25f1,
                  "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_boolean(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                 );
  }
  xVar3 = rettype(expr);
  if (xVar3 == xpath_type_number) {
    __assert_fail("expr->rettype() != xpath_type_number",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                  ,0x25f2,
                  "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_boolean(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                 );
  }
  size = 1;
  sVar4 = xpath_node_set_raw::size(ns);
  pxVar5 = xpath_node_set_raw::begin(ns);
  c.size = (size_t)(pxVar5 + first);
  it = (xpath_node *)c.size;
  for (; sVar1 = c.size, pxVar5 = xpath_node_set_raw::end(ns), __length = extraout_RDX,
      (xpath_node *)sVar1 != pxVar5; c.size = c.size + 0x10) {
    xpath_context::xpath_context((xpath_context *)local_70,(xpath_node *)c.size,size,sVar4 - first);
    bVar2 = eval_boolean(expr,(xpath_context *)local_70,stack);
    if (bVar2) {
      pxVar5 = it + 1;
      __length = *(xml_node_struct **)c.size;
      (it->_node)._root = __length;
      (it->_attribute)._attr = *(xml_attribute_struct **)(c.size + 8);
      it = pxVar5;
      if (once) break;
    }
    size = size + 1;
  }
  xpath_node_set_raw::truncate(ns,(char *)it,(__off_t)__length);
  return;
}

Assistant:

static void apply_predicate_boolean(xpath_node_set_raw& ns, size_t first, xpath_ast_node* expr, const xpath_stack& stack, bool once)
		{
			assert(ns.size() >= first);
			assert(expr->rettype() != xpath_type_number);

			size_t i = 1;
			size_t size = ns.size() - first;

			xpath_node* last = ns.begin() + first;

			// remove_if... or well, sort of
			for (xpath_node* it = last; it != ns.end(); ++it, ++i)
			{
				xpath_context c(*it, i, size);

				if (expr->eval_boolean(c, stack))
				{
					*last++ = *it;

					if (once) break;
				}
			}

			ns.truncate(last);
		}